

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O1

int query_category(char *qstr,obj *olist,int qflags,int *pick_list,int how)

{
  nh_menuitem *pnVar1;
  char cVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  char *pack;
  obj *poVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  int ccount;
  ulong uVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  ulong uVar16;
  byte bVar17;
  int *results;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  bool bVar21;
  bool bVar22;
  menulist menu;
  int valid_oclasses [18];
  char buf [256];
  menulist local_1c8;
  char local_1b7;
  bool local_1b6;
  bool local_1b5;
  bool local_1b4;
  char local_1b3;
  char local_1b2;
  char local_1b1;
  obj *local_1b0;
  int *local_1a8;
  ulong local_1a0;
  int local_194;
  char *local_190;
  int local_188 [20];
  char local_138 [264];
  
  if (olist == (obj *)0x0) {
    return 0;
  }
  bVar22 = true;
  local_1b6 = true;
  local_1a8 = pick_list;
  if ((qflags & 2U) != 0) {
    iVar7 = count_unpaid(olist);
    local_1b6 = iVar7 == 0;
  }
  bVar17 = false;
  if ((char)qflags < '\0') {
    iVar7 = count_buc(olist,0x80);
    bVar22 = iVar7 == 0;
    bVar17 = !bVar22;
  }
  bVar11 = true;
  local_1b2 = bVar22;
  if (((uint)qflags >> 8 & 1) == 0) {
    local_1b5 = true;
  }
  else {
    iVar7 = count_buc(olist,0x100);
    local_1b5 = iVar7 == 0;
    bVar17 = bVar17 + !local_1b5;
  }
  if (((uint)qflags >> 9 & 1) != 0) {
    iVar7 = count_buc(olist,0x200);
    bVar11 = iVar7 == 0;
    bVar17 = bVar17 + !bVar11;
  }
  local_1b3 = '\x01';
  if (((uint)qflags >> 10 & 1) == 0) {
    local_1b4 = true;
  }
  else {
    iVar7 = count_buc(olist,0x400);
    local_1b4 = iVar7 == 0;
    bVar17 = bVar17 + !local_1b4;
  }
  local_1b1 = bVar11;
  local_194 = how;
  local_190 = qstr;
  if (((uint)qflags >> 0xb & 1) != 0) {
    iVar7 = count_buc(olist,0x800);
    local_1b3 = iVar7 == 0;
  }
  pcVar15 = flags.inv_order;
  uVar12 = (ulong)(qflags * 8 & 8);
  iVar7 = 0;
  do {
    bVar22 = false;
    poVar8 = olist;
    do {
      if (poVar8->oclass == *pcVar15) {
        if ((qflags & 8U) == 0) {
          if (!bVar22) {
LAB_00210f19:
            iVar7 = iVar7 + 1;
          }
          bVar22 = true;
        }
        else if (!bVar22 && (poVar8->owornmask & 0xf077fU) != 0) goto LAB_00210f19;
      }
      poVar8 = *(obj **)((long)poVar8->oextra + (uVar12 - 100));
    } while (poVar8 != (obj *)0x0);
    pcVar13 = pcVar15 + 1;
    pcVar15 = pcVar15 + 1;
  } while (*pcVar13 != '\0');
  local_1b0 = olist;
  if ((((qflags & 0x20U) == 0) && ((iVar7 == 1 & local_1b6) != 0)) && (bVar17 < 2)) {
    poVar8 = olist;
    if (((qflags & 8U) == 0) || ((olist->owornmask & 0xf077fU) != 0)) {
      bVar22 = false;
    }
    else {
      do {
        poVar8 = *(obj **)((long)poVar8->oextra + (uVar12 - 100));
        bVar22 = poVar8 == (obj *)0x0;
        if (((qflags & 8U) == 0) || (poVar8 == (obj *)0x0)) break;
      } while ((poVar8->owornmask & 0xf077fU) == 0);
    }
    if (bVar22) {
      return 0;
    }
    *local_1a8 = (int)poVar8->oclass;
    uVar19 = 1;
    uVar12 = 0;
    results = local_1a8;
  }
  else {
    init_menulist(&local_1c8);
    local_1b7 = 'a';
    if (1 < iVar7 && (qflags & 0x10U) != 0) {
      lVar20 = (long)local_1c8.size;
      if (local_1c8.size <= local_1c8.icount) {
        local_1c8.size = local_1c8.size * 2;
        local_1c8.items = (nh_menuitem *)realloc(local_1c8.items,lVar20 * 0x218);
      }
      pcVar15 = local_1c8.items[local_1c8.icount].caption;
      ((nh_menuitem *)(pcVar15 + -8))->id = -2;
      ((nh_menuitem *)(pcVar15 + -8))->role = MI_NORMAL;
      *(undefined2 *)(pcVar15 + 0x100) = 0x61;
      pcVar15[0x102] = '\0';
      pcVar13 = "All worn types";
      if ((qflags & 8U) == 0) {
        pcVar13 = "All types";
      }
      strcpy(pcVar15,pcVar13);
      local_1c8.icount = local_1c8.icount + 1;
      local_1b7 = 'b';
    }
    pcVar15 = flags.inv_order;
    local_1a0 = 0;
    do {
      bVar22 = false;
      poVar8 = olist;
      do {
        if (olist->oclass == *pcVar15) {
          if ((qflags & 8U) == 0) {
            if (bVar22) {
              bVar22 = true;
            }
            else {
LAB_0021104e:
              cVar2 = ""[objects[olist->otyp].oc_class];
              pcVar13 = let_to_name(*pcVar15,'\0');
              sprintf(local_138,"%s  (\'%c\')",pcVar13,(ulong)(uint)(int)cVar2);
              lVar20 = (long)local_1c8.size;
              if (local_1c8.size <= local_1c8.icount) {
                local_1c8.size = local_1c8.size * 2;
                local_1c8.items = (nh_menuitem *)realloc(local_1c8.items,lVar20 * 0x218);
              }
              pnVar1 = local_1c8.items + local_1c8.icount;
              pnVar1->id = (int)olist->oclass;
              pnVar1->role = MI_NORMAL;
              pnVar1->accel = local_1b7;
              pnVar1->group_accel = '\0';
              pnVar1->selected = '\0';
              strcpy(pnVar1->caption,local_138);
              lVar20 = (long)local_1c8.icount;
              local_1c8.icount = local_1c8.icount + 1;
              local_1c8.items[lVar20].group_accel = cVar2;
              bVar22 = true;
              if ((iflags.menu_match_tight == '\0') || (olist->oclass == 0xc)) {
LAB_00211170:
                bVar11 = true;
              }
              else {
                iVar7 = (int)local_1a0;
                local_1a0 = (ulong)(iVar7 + 1);
                local_188[iVar7] = (int)olist->oclass;
                if (iVar7 < 0x11) goto LAB_00211170;
                free(local_1c8.items);
                bVar11 = false;
                impossible("query_category: too many oclasses");
              }
              if (!bVar11) {
                return 0;
              }
              local_1b7 = local_1b7 + '\x01';
              poVar8 = local_1b0;
            }
          }
          else if (!bVar22 && (olist->owornmask & 0xf077fU) != 0) goto LAB_0021104e;
        }
        pcVar13 = local_190;
        iVar7 = local_194;
        results = local_1a8;
        cVar2 = local_1b1;
        olist = *(obj **)((long)olist->oextra + (uVar12 - 100));
      } while (olist != (obj *)0x0);
      if ('t' < local_1b7) {
        free(local_1c8.items);
        impossible("query_category: too many categories");
        return 0;
      }
      pcVar14 = pcVar15 + 1;
      pcVar15 = pcVar15 + 1;
      olist = poVar8;
    } while (*pcVar14 != '\0');
    if (local_1b6 == false) {
      lVar20 = (long)local_1c8.size;
      if (local_1c8.size <= local_1c8.icount) {
        local_1c8.size = local_1c8.size * 2;
        local_1c8.items = (nh_menuitem *)realloc(local_1c8.items,lVar20 * 0x218);
      }
      lVar20 = (long)local_1c8.icount;
      local_1c8.items[lVar20].id = 0x75;
      local_1c8.items[lVar20].role = MI_NORMAL;
      local_1c8.items[lVar20].accel = 'u';
      local_1c8.items[lVar20].group_accel = '\0';
      local_1c8.items[lVar20].selected = '\0';
      builtin_strncpy(local_1c8.items[lVar20].caption,"Unpaid i",8);
      builtin_strncpy(local_1c8.items[lVar20].caption + 5,"d items",8);
      local_1c8.icount = local_1c8.icount + 1;
    }
    if ((qflags & 0x20U) != 0) {
      lVar20 = (long)local_1c8.size;
      if (local_1c8.size <= local_1c8.icount) {
        local_1c8.size = local_1c8.size * 2;
        local_1c8.items = (nh_menuitem *)realloc(local_1c8.items,lVar20 * 0x218);
      }
      lVar20 = (long)local_1c8.icount;
      local_1c8.items[lVar20].id = 0x78;
      local_1c8.items[lVar20].role = MI_NORMAL;
      local_1c8.items[lVar20].accel = 'x';
      local_1c8.items[lVar20].group_accel = '\0';
      local_1c8.items[lVar20].selected = '\0';
      builtin_strncpy(local_1c8.items[lVar20].caption,"Unpaid items alr",0x10);
      builtin_strncpy(local_1c8.items[lVar20].caption + 0xd,"already used up",0x10);
      local_1c8.icount = local_1c8.icount + 1;
    }
    if ((qflags & 0x40U) != 0) {
      lVar20 = (long)local_1c8.size;
      if (local_1c8.size <= local_1c8.icount) {
        local_1c8.size = local_1c8.size * 2;
        local_1c8.items = (nh_menuitem *)realloc(local_1c8.items,lVar20 * 0x218);
      }
      pcVar15 = local_1c8.items[local_1c8.icount].caption;
      ((nh_menuitem *)(pcVar15 + -8))->id = 0x41;
      ((nh_menuitem *)(pcVar15 + -8))->role = MI_NORMAL;
      *(undefined2 *)(pcVar15 + 0x100) = 0x41;
      pcVar15[0x102] = '\0';
      pcVar14 = "Auto-select every item being worn";
      if ((qflags & 8U) == 0) {
        pcVar14 = "Auto-select every item";
      }
      strcpy(pcVar15,pcVar14);
      local_1c8.icount = local_1c8.icount + 1;
    }
    if (local_1b3 == '\0') {
      lVar20 = (long)local_1c8.size;
      if (local_1c8.size <= local_1c8.icount) {
        local_1c8.size = local_1c8.size * 2;
        local_1c8.items = (nh_menuitem *)realloc(local_1c8.items,lVar20 * 0x218);
      }
      lVar20 = (long)local_1c8.icount;
      local_1c8.items[lVar20].id = 0x49;
      local_1c8.items[lVar20].role = MI_NORMAL;
      local_1c8.items[lVar20].accel = 'I';
      local_1c8.items[lVar20].group_accel = '\0';
      local_1c8.items[lVar20].selected = '\0';
      builtin_strncpy(local_1c8.items[lVar20].caption,"Unidentified Ite",0x10);
      builtin_strncpy(local_1c8.items[lVar20].caption + 0xf,"ems",4);
      local_1c8.icount = local_1c8.icount + 1;
    }
    if (local_1b2 == '\0') {
      lVar20 = (long)local_1c8.size;
      if (local_1c8.size <= local_1c8.icount) {
        local_1c8.size = local_1c8.size * 2;
        local_1c8.items = (nh_menuitem *)realloc(local_1c8.items,lVar20 * 0x218);
      }
      lVar20 = (long)local_1c8.icount;
      local_1c8.items[lVar20].id = 0x42;
      local_1c8.items[lVar20].role = MI_NORMAL;
      local_1c8.items[lVar20].accel = 'B';
      local_1c8.items[lVar20].group_accel = '\0';
      local_1c8.items[lVar20].selected = '\0';
      builtin_strncpy(local_1c8.items[lVar20].caption,"Items known to b",0x10);
      builtin_strncpy(local_1c8.items[lVar20].caption + 10,"n to be Blessed",0x10);
      local_1c8.icount = local_1c8.icount + 1;
    }
    if (local_1b5 == false) {
      lVar20 = (long)local_1c8.size;
      if (local_1c8.size <= local_1c8.icount) {
        local_1c8.size = local_1c8.size * 2;
        local_1c8.items = (nh_menuitem *)realloc(local_1c8.items,lVar20 * 0x218);
      }
      lVar20 = (long)local_1c8.icount;
      local_1c8.items[lVar20].id = 0x43;
      local_1c8.items[lVar20].role = MI_NORMAL;
      local_1c8.items[lVar20].accel = 'C';
      local_1c8.items[lVar20].group_accel = '\0';
      local_1c8.items[lVar20].selected = '\0';
      builtin_strncpy(local_1c8.items[lVar20].caption,"Items known to b",0x10);
      builtin_strncpy(local_1c8.items[lVar20].caption + 9,"wn to be Cursed",0x10);
      local_1c8.icount = local_1c8.icount + 1;
    }
    if (cVar2 == '\0') {
      lVar20 = (long)local_1c8.size;
      if (local_1c8.size <= local_1c8.icount) {
        local_1c8.size = local_1c8.size * 2;
        local_1c8.items = (nh_menuitem *)realloc(local_1c8.items,lVar20 * 0x218);
      }
      lVar20 = (long)local_1c8.icount;
      local_1c8.items[lVar20].id = 0x55;
      local_1c8.items[lVar20].role = MI_NORMAL;
      local_1c8.items[lVar20].accel = 'U';
      local_1c8.items[lVar20].group_accel = '\0';
      local_1c8.items[lVar20].selected = '\0';
      builtin_strncpy(local_1c8.items[lVar20].caption,"Items known to b",0x10);
      builtin_strncpy(local_1c8.items[lVar20].caption + 0xb," to be Uncursed",0x10);
      local_1c8.icount = local_1c8.icount + 1;
    }
    if (local_1b4 == false) {
      lVar20 = (long)local_1c8.size;
      if (local_1c8.size <= local_1c8.icount) {
        local_1c8.size = local_1c8.size * 2;
        local_1c8.items = (nh_menuitem *)realloc(local_1c8.items,lVar20 * 0x218);
      }
      lVar20 = (long)local_1c8.icount;
      local_1c8.items[lVar20].id = 0x58;
      local_1c8.items[lVar20].role = MI_NORMAL;
      local_1c8.items[lVar20].accel = 'X';
      local_1c8.items[lVar20].group_accel = '\0';
      local_1c8.items[lVar20].selected = '\0';
      builtin_strncpy(local_1c8.items[lVar20].caption,"Items of unknown",0x10);
      builtin_strncpy(local_1c8.items[lVar20].caption + 0xe,"wn B/C/U status",0x10);
      local_1c8.icount = local_1c8.icount + 1;
    }
    uVar9 = display_menu(local_1c8.items,local_1c8.icount,pcVar13,iVar7,results);
    free(local_1c8.items);
    uVar19 = 0;
    uVar12 = local_1a0;
    if (0 < (int)uVar9) {
      uVar19 = (ulong)uVar9;
    }
  }
  uVar9 = (uint)uVar19;
  if (iflags.menu_match_tight == '\0') {
    return uVar9;
  }
  if (uVar9 == 0) {
    return 0;
  }
  iVar7 = (int)uVar12;
  uVar16 = 0;
  bVar6 = false;
  bVar5 = false;
  bVar22 = false;
  bVar4 = false;
  bVar11 = false;
  do {
    iVar3 = results[uVar16];
    if ((0 < iVar7) && (!bVar22)) {
      lVar20 = 1;
      do {
        if (iVar3 == local_188[lVar20 + -1]) {
          bVar22 = true;
        }
      } while ((lVar20 < iVar7) && (lVar20 = lVar20 + 1, !bVar22));
    }
    uVar10 = (ulong)(iVar3 - 0x41U);
    if (iVar3 - 0x41U < 0x38) {
      if ((0x90000000900106U >> (uVar10 & 0x3f) & 1) == 0) {
        if (uVar10 == 0) {
          bVar6 = true;
        }
        else {
          if (uVar10 != 0x20) goto LAB_0021169e;
          bVar11 = true;
        }
      }
      else {
        bVar5 = true;
      }
    }
    else {
LAB_0021169e:
      if (iVar3 == 0xc) {
        bVar4 = true;
      }
    }
    uVar16 = uVar16 + 1;
  } while (uVar16 != uVar19);
  if (bVar11) {
    return uVar9;
  }
  if ((!bVar22 && !bVar5) && bVar4) {
    return uVar9;
  }
  bVar6 = !bVar6;
  if ((uVar9 < 0x1e) || (bVar22 && ((((bVar4 || bVar22) || bVar5) || bVar6) && bVar5))) {
    uVar16 = uVar19;
    if (((!bVar4 && !bVar22) && !bVar5) && !bVar6) {
      uVar16 = (ulong)(uVar9 + 1);
      results[uVar19] = 0xc;
    }
    uVar9 = (uint)uVar16;
    if (((int)uVar9 < 0x1e) || (bVar22 && ((((bVar4 || bVar22) || bVar5) || bVar6) && bVar5))) {
      if ((((!bVar4 && !bVar22) && !bVar5) && !bVar6) || (uVar18 = uVar9, !bVar22)) {
        bVar11 = 0 < iVar7;
        if ((0 < iVar7) && ((int)uVar9 < 0x1e)) {
          uVar18 = 0x1d - uVar9;
          if (iVar7 - 1U < 0x1d - uVar9) {
            uVar18 = iVar7 - 1U;
          }
          memcpy(results + uVar16,local_188,(ulong)uVar18 * 4 + 4);
          uVar10 = 1;
          uVar19 = uVar16;
          do {
            uVar16 = uVar19 + 1;
            bVar11 = uVar10 < (uVar12 & 0xffffffff);
            if (!bVar11) break;
            uVar10 = uVar10 + 1;
            bVar21 = uVar19 < 0x1d;
            uVar19 = uVar16;
          } while (bVar21);
        }
        uVar9 = (uint)uVar16;
        uVar18 = uVar9;
        if ((0x1d < (int)uVar9) && ((((!bVar4 && !bVar22) && !bVar5) && !bVar6 || !bVar5) || bVar11)
           ) {
          bVar22 = false;
          pcVar15 = "oclasses";
          goto LAB_00211861;
        }
      }
      bVar22 = true;
      uVar9 = uVar18;
      if (!bVar5) {
        uVar9 = uVar18 + 1;
        results[(int)uVar18] = 0x42;
        pcVar15 = "BUCs";
        if (0x1c < (int)uVar18) {
          bVar22 = false;
          goto LAB_00211861;
        }
        results[(int)uVar9] = 0x43;
        if ((uVar18 == 0x1c) || (results[(long)(int)uVar18 + 2] = 0x55, 0x1a < (int)uVar18)) {
          bVar22 = false;
          uVar9 = 0x1e;
          goto LAB_00211861;
        }
        uVar9 = uVar18 + 4;
        results[(long)(int)uVar18 + 3] = 0x58;
      }
      pcVar15 = (char *)0x0;
    }
    else {
      bVar22 = false;
      pcVar15 = "COIN_CLASS";
    }
  }
  else {
    bVar22 = false;
    pcVar15 = "anything";
  }
LAB_00211861:
  if (!bVar22) {
    warning("query_category: no room in pick_list to add %s",pcVar15);
  }
  return uVar9;
}

Assistant:

int query_category(const char *qstr,	/* query string */
		   struct obj *olist,	/* the list to pick from */
		   int qflags,		/* behaviour modification flags */
		   int *pick_list,	/* return list of items picked */
		   int how)		/* type of query */
{
	int n;
	struct obj *curr;
	char *pack;
	boolean collected_type_name;
	char invlet;
	int ccount;
	boolean do_unpaid = FALSE;
	boolean do_blessed = FALSE, do_cursed = FALSE, do_uncursed = FALSE,
	    do_buc_unknown = FALSE, do_unidentified = FALSE;
	int num_buc_types = 0;
	struct menulist menu;
	int valid_oclasses[MAXOCLASSES]; /* excludes COIN_CLASS */
	int num_valid_oclasses = 0;

	if (!olist)
	    return 0;
	if ((qflags & UNPAID_TYPES) && count_unpaid(olist))
	    do_unpaid = TRUE;
	if ((qflags & BUC_BLESSED) && count_buc(olist, BUC_BLESSED)) {
	    do_blessed = TRUE;
	    num_buc_types++;
	}
	if ((qflags & BUC_CURSED) && count_buc(olist, BUC_CURSED)) {
	    do_cursed = TRUE;
	    num_buc_types++;
	}
	if ((qflags & BUC_UNCURSED) && count_buc(olist, BUC_UNCURSED)) {
	    do_uncursed = TRUE;
	    num_buc_types++;
	}
	if ((qflags & BUC_UNKNOWN) && count_buc(olist, BUC_UNKNOWN)) {
	    do_buc_unknown = TRUE;
	    num_buc_types++;
	}
	if ((qflags & UNIDENTIFIED) && count_buc(olist, UNIDENTIFIED))
	    do_unidentified = TRUE;

	ccount = count_categories(olist, qflags);
	/* no point in actually showing a menu for a single category */
	if (ccount == 1 && !do_unpaid && num_buc_types <= 1 &&
	    !(qflags & BILLED_TYPES)) {
	    for (curr = olist; curr; curr = FOLLOW(curr, qflags)) {
		if ((qflags & WORN_TYPES) &&
		    !(curr->owornmask & (W_ARMOR|W_RING|W_AMUL|W_TOOL|W_WEP|W_SWAPWEP|W_QUIVER)))
		    continue;
		break;
	    }
	    if (curr) {
		pick_list[0] = curr->oclass;
		n = 1;
		goto fudge_choices;
	    }
	    return 0;
	}
	
	init_menulist(&menu);

	pack = flags.inv_order;
	invlet = 'a';
	if ((qflags & ALL_TYPES) && (ccount > 1)) {
		add_menuitem(&menu, ALL_TYPES_SELECTED, (qflags & WORN_TYPES) ?
		             "All worn types" : "All types", invlet, FALSE);
		invlet = 'b';
	}
	
	do {
	    collected_type_name = FALSE;
	    for (curr = olist; curr; curr = FOLLOW(curr, qflags)) {
		if (curr->oclass == *pack) {
		   if ((qflags & WORN_TYPES) &&
		   		!(curr->owornmask & (W_ARMOR | W_RING | W_AMUL | W_TOOL |
		    	W_WEP | W_SWAPWEP | W_QUIVER)))
			 continue;
		   if (!collected_type_name) {
			char oc_sym, buf[BUFSZ];
			oc_sym = def_oc_syms[(int)objects[curr->otyp].oc_class];
			sprintf(buf, "%s  ('%c')", let_to_name(*pack, FALSE), oc_sym);
			add_menuitem(&menu, curr->oclass, buf, invlet++, FALSE);
			menu.items[menu.icount - 1].group_accel = oc_sym;
			collected_type_name = TRUE;
			/* Gold is handled separately. */
			if (iflags.menu_match_tight && curr->oclass != COIN_CLASS) {
			    valid_oclasses[num_valid_oclasses++] = curr->oclass;
			    if (num_valid_oclasses >= MAXOCLASSES) {
				free(menu.items);
				impossible("query_category: too many oclasses");
				return 0;
			    }
			}
		   }
		}
	    }
	    pack++;
	    if (invlet >= 'u') {
		free(menu.items);
		impossible("query_category: too many categories");
		return 0;
	    }
	} while (*pack);
	/* unpaid items if there are any */
	if (do_unpaid)
	    add_menuitem(&menu, 'u', "Unpaid items", 'u', FALSE);
	
	/* billed items: checked by caller, so always include if BILLED_TYPES */
	if (qflags & BILLED_TYPES)
	    add_menuitem(&menu, 'x', "Unpaid items already used up", 'x', FALSE);
	
	if (qflags & CHOOSE_ALL)
	    add_menuitem(&menu, 'A', (qflags & WORN_TYPES) ?
		    "Auto-select every item being worn" :
		    "Auto-select every item", 'A', FALSE);
	
	if (do_unidentified)
	    add_menuitem(&menu, 'I', "Unidentified Items", 'I', FALSE);
	
	/* items with b/u/c/unknown if there are any */
	if (do_blessed)
	    add_menuitem(&menu, 'B', "Items known to be Blessed", 'B', FALSE);
	
	if (do_cursed)
	    add_menuitem(&menu, 'C', "Items known to be Cursed", 'C', FALSE);
	
	if (do_uncursed)
	    add_menuitem(&menu, 'U', "Items known to be Uncursed", 'U', FALSE);
	
	if (do_buc_unknown)
	    add_menuitem(&menu, 'X', "Items of unknown B/C/U status", 'X', FALSE);
	
	n = display_menu(menu.items, menu.icount, qstr, how, pick_list);
	free(menu.items);
	if (n < 0)
	    n = 0;	/* callers don't expect -1 */

	/*
	 * Fudge menu choices since allow_category() requires at least
	 * an object class and some object property to show anything.
	 *
	 * - Choosing all [a] goes through allow_all(), which skips all of this.
	 * - Choosing gold [$] always shows gold, since it's not subjected
	 *   the usual property checks.
	 * - Choosing only gold [$] excludes all other objects.
	 * - Auto-select all with nothing else includes gold and all objects.
	 * - Choosing classes w/out properties auto-matches any BUC to match
	 *   all objects of that class.
	 * - Choosing properties w/out classes auto-matches all classes to match
	 *   all objects with those properties.
	 */
fudge_choices:
	if (iflags.menu_match_tight && n > 0) {
	    boolean all_chosen = FALSE;
	    boolean gold_chosen = FALSE;
	    boolean oclass_chosen = FALSE;
	    boolean oprop_chosen = FALSE;
	    boolean autosel_chosen = FALSE;
	    boolean add_gold = FALSE;
	    boolean add_oclasses = FALSE;
	    boolean add_bucs = FALSE;
	    const char *failed_at = NULL; /* 30 == hard-coded pick_list[] length */
	    int i, j;

	    /* Analyze menu choices. */
	    for (i = 0; i < n; i++) {
		int pick = pick_list[i];
		for (j = 0; j < num_valid_oclasses && !oclass_chosen; j++) {
		    if (pick == valid_oclasses[j])
			oclass_chosen = TRUE;
		}
		switch (pick) {
		case 'a':
		    all_chosen = TRUE;
		    break;
		case COIN_CLASS:
		    gold_chosen = TRUE;
		    break;
		case 'B': case 'C': case 'U': case 'X':
		case 'u': case 'x': case 'I':
		    oprop_chosen = TRUE;
		    break;
		case 'A':
		    autosel_chosen = TRUE;
		    break;
		}
	    }

	    /* Choosing all [a] means no special fudging is needed. */
	    if (all_chosen)
		return n;

	    /* If only gold is chosen, don't show anything else. */
	    if (gold_chosen && !(oclass_chosen || oprop_chosen))
		return n;

	    if (autosel_chosen && !(gold_chosen || oclass_chosen || oprop_chosen)) {
		/* If only auto-select all is chosen, add everything. */
		add_gold = TRUE;
		add_oclasses = TRUE;
		add_bucs = TRUE;
	    } else {
		/* Add all oclasses if needed. */
		if (!oclass_chosen)
		    add_oclasses = TRUE;
		/* Add all BUCs if no oprops were chosen. */
		if (!oprop_chosen)
		    add_bucs = TRUE;
	    }

	    if (n >= 30 && (add_gold || add_oclasses || add_bucs)) {
		failed_at = "anything";
		goto append_fail;
	    }

	    if (add_gold)
		pick_list[n++] = COIN_CLASS;
	    if (n >= 30 && (add_oclasses || add_bucs)) {
		failed_at = "COIN_CLASS";
		goto append_fail;
	    }

	    if (add_oclasses) {
		for (j = 0; j < num_valid_oclasses && n < 30; j++)
		    pick_list[n++] = valid_oclasses[j];
		if (n >= 30 && (j < num_valid_oclasses || add_bucs)) {
		    failed_at = "oclasses";
		    goto append_fail;
		}
	    }

	    if (add_bucs) {
		pick_list[n++] = 'B';
		if (n >= 30) {
		    failed_at = "BUCs";
		    goto append_fail;
		}
		pick_list[n++] = 'C';
		if (n >= 30) {
		    failed_at = "BUCs";
		    goto append_fail;
		}
		pick_list[n++] = 'U';
		if (n >= 30) {
		    failed_at = "BUCs";
		    goto append_fail;
		}
		pick_list[n++] = 'X';
	    }

append_fail:
	    if (failed_at)
		warning("query_category: no room in pick_list to add %s", failed_at);
	}

	return n;
}